

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O1

RK_S32 mpp_av1_frame_reference_mode(AV1Context *ctx,BitReadCtx_t *gb,AV1RawFrameHeader *current)

{
  RK_S32 RVar1;
  undefined8 in_RAX;
  RK_U32 value;
  undefined1 local_14 [4];
  
  local_14[0] = (undefined1)((ulong)in_RAX >> 0x20);
  if ((gb->field_0xc & 0xfd) == 0) {
    *(undefined1 *)&gb[7].emulation_prevention_bytes_ = 0;
    RVar1 = 0;
  }
  else {
    RVar1 = mpp_av1_read_unsigned(&ctx->gb,1,"reference_select",(RK_U32 *)local_14,0,1);
    if (-1 < RVar1) {
      *(undefined1 *)&gb[7].emulation_prevention_bytes_ = local_14[0];
      RVar1 = 0;
    }
  }
  return RVar1;
}

Assistant:

static RK_S32 mpp_av1_frame_reference_mode(AV1Context *ctx, BitReadCtx_t *gb,
                                           AV1RawFrameHeader *current)
{
    RK_S32 err;
    (void)ctx;
    if (current->frame_type == AV1_FRAME_INTRA_ONLY ||
        current->frame_type == AV1_FRAME_KEY)
        infer(reference_select, 0);
    else
        flag(reference_select);

    return 0;
}